

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int g_write(lua_State *L,FILE *f,int arg)

{
  int iVar1;
  int iVar2;
  size_t in_RAX;
  int *piVar3;
  lua_Integer lVar4;
  char *__ptr;
  size_t sVar5;
  bool bVar6;
  size_t l;
  size_t local_38;
  
  local_38 = in_RAX;
  iVar1 = lua_gettop(L);
  piVar3 = __errno_location();
  *piVar3 = 0;
  iVar2 = 1;
  if (iVar1 != arg) {
    bVar6 = true;
    do {
      iVar2 = lua_type(L,arg);
      if (iVar2 == 3) {
        iVar2 = lua_isinteger(L,arg);
        if (iVar2 == 0) {
          lua_tonumberx(L,arg,(int *)0x0);
          iVar2 = fprintf((FILE *)f,"%.14g");
        }
        else {
          lVar4 = lua_tointegerx(L,arg,(int *)0x0);
          iVar2 = fprintf((FILE *)f,"%lld",lVar4);
        }
        bVar6 = (bool)(0 < iVar2 & bVar6);
      }
      else {
        __ptr = luaL_checklstring(L,arg,&local_38);
        if (bVar6) {
          sVar5 = fwrite(__ptr,1,local_38,(FILE *)f);
          bVar6 = sVar5 == local_38;
        }
        else {
          bVar6 = false;
        }
      }
      arg = arg + 1;
    } while (iVar1 != arg);
    iVar2 = 1;
    if (!bVar6) {
      iVar2 = luaL_fileresult(L,0,(char *)0x0);
    }
  }
  return iVar2;
}

Assistant:

static int g_write (lua_State *L, FILE *f, int arg) {
  int nargs = lua_gettop(L) - arg;
  int status = 1;
  errno = 0;
  for (; nargs--; arg++) {
    if (lua_type(L, arg) == LUA_TNUMBER) {
      /* optimization: could be done exactly as for strings */
      int len = lua_isinteger(L, arg)
                ? fprintf(f, LUA_INTEGER_FMT,
                             (LUAI_UACINT)lua_tointeger(L, arg))
                : fprintf(f, LUA_NUMBER_FMT,
                             (LUAI_UACNUMBER)lua_tonumber(L, arg));
      status = status && (len > 0);
    }
    else {
      size_t l;
      const char *s = luaL_checklstring(L, arg, &l);
      status = status && (fwrite(s, sizeof(char), l, f) == l);
    }
  }
  if (l_likely(status))
    return 1;  /* file handle already on stack top */
  else
    return luaL_fileresult(L, status, NULL);
}